

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecrt.cpp
# Opt level: O0

char * CorUnix::InternalFgets(char *sz,int nSize,FILE *f,bool fTextMode)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  size_t sVar4;
  int len;
  char *retval;
  bool fTextMode_local;
  FILE *f_local;
  int nSize_local;
  char *sz_local;
  
  if (sz == (char *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalFgets",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/filecrt.cpp"
            ,0x1b2);
    fprintf(_stderr,"Expression: sz != NULL\n");
  }
  if (f == (FILE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalFgets",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/filecrt.cpp"
            ,0x1b3);
    fprintf(_stderr,"Expression: f != NULL\n");
  }
  do {
    pcVar2 = fgets(sz,nSize,(FILE *)f);
    if (pcVar2 == (char *)0x0) {
      iVar1 = feof((FILE *)f);
      if (iVar1 != 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
          return (char *)0x0;
        }
        abort();
      }
      piVar3 = __errno_location();
      if (*piVar3 != 4) {
        if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
          piVar3 = __errno_location();
          strerror(*piVar3);
          return (char *)0x0;
        }
        abort();
      }
      clearerr((FILE *)f);
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
    if (fTextMode) {
      sVar4 = strlen(sz);
      iVar1 = (int)sVar4;
      if (((1 < iVar1) && (sz[iVar1 + -1] == '\n')) && (sz[iVar1 + -2] == '\r')) {
        sz[iVar1 + -2] = '\n';
        sz[iVar1 + -1] = '\0';
      }
    }
    if (pcVar2 != (char *)0x0) {
      return pcVar2;
    }
  } while( true );
}

Assistant:

char *
CorUnix::InternalFgets(
    char *sz,
    int nSize,
    FILE *f,
    bool fTextMode
    )
{
    char *retval = NULL;

    _ASSERTE(sz != NULL);
    _ASSERTE(f != NULL);

#if FILE_OPS_CHECK_FERROR_OF_PREVIOUS_CALL
    clearerr(f);
#endif

    do
    {
        retval =  fgets(sz, nSize, f);
        if (NULL==retval)
        {
            if (feof(f))
            {
                TRACE("Reached EOF\n");
                break;
            }
            /* The man page suggests using ferror and feof to distinguish
               between error and EOF, but feof and errno is sufficient.
               Not all cases that set errno also flag ferror, so just
               checking errno is the best solution. */
            if (EINTR != errno)
            {
                WARN("got error; errno is %d (%s)\n",errno, strerror(errno));
                break;
            }
            /* we ignored a EINTR error, reset the stream's error state */
            clearerr(f);
            TRACE("call got interrupted (EINTR), trying again\n");
        }
        if (fTextMode)
        {
            int len = strlen(sz);
            if ((len>=2) && (sz[len-1]=='\n') && (sz[len-2]=='\r'))
            {
                sz[len-2]='\n';
                sz[len-1]='\0';
            }
        }
    } while(NULL == retval);

    return retval;
}